

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

DdNode * cuddBddMakePrime(DdManager *dd,DdNode *cube,DdNode *f)

{
  bool bVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *g;
  DdNode *e;
  DdNode *t;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(cube);
  g = cube;
  do {
    if ((ulong)*(uint *)((ulong)g & 0xfffffffffffffffe) == 0x7fffffff) {
      if (g != dd->one) {
        Cudd_RecursiveDeref(dd,cube);
        return (DdNode *)0x0;
      }
      Cudd_Deref(cube);
      return cube;
    }
    pDVar3 = Cudd_bddExistAbstract(dd,cube,dd->vars[*(uint *)((ulong)g & 0xfffffffffffffffe)]);
    if (pDVar3 == (DdNode *)0x0) {
      bVar1 = false;
      pDVar3 = g;
    }
    else {
      Cudd_Ref(pDVar3);
      iVar2 = Cudd_bddLeq(dd,pDVar3,f);
      if (iVar2 == 0) {
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      else {
        Cudd_RecursiveDeref(dd,cube);
        cube = pDVar3;
      }
      cuddGetBranches(g,&local_38,&local_40);
      bVar1 = true;
      pDVar3 = local_40;
      if ((local_38 != pDVar4) && (pDVar3 = local_38, local_40 != pDVar4)) {
        Cudd_RecursiveDeref(dd,cube);
        bVar1 = false;
        pDVar3 = g;
      }
    }
    g = pDVar3;
  } while (bVar1);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddMakePrime(
  DdManager *dd /* manager */,
  DdNode *cube /* cube to be expanded */,
  DdNode *f /* function of which the cube is to be made a prime */)
{
    DdNode *scan;
    DdNode *t, *e;
    DdNode *res = cube;
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    Cudd_Ref(res);
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        DdNode *reg = Cudd_Regular(scan);
        DdNode *var = dd->vars[reg->index];
        DdNode *expanded = Cudd_bddExistAbstract(dd,res,var);
        if (expanded == NULL) {
            return(NULL);
        }
        Cudd_Ref(expanded);
        if (Cudd_bddLeq(dd,expanded,f)) {
            Cudd_RecursiveDeref(dd,res);
            res = expanded;
        } else {
            Cudd_RecursiveDeref(dd,expanded);
        }
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            scan = e;
        } else if (e == zero) {
            scan = t;
        } else {
            Cudd_RecursiveDeref(dd,res);
            return(NULL);       /* cube is not a cube */
        }
    }

    if (scan == DD_ONE(dd)) {
        Cudd_Deref(res);
        return(res);
    } else {
        Cudd_RecursiveDeref(dd,res);
        return(NULL);
    }

}